

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O0

bool __thiscall diffusion::Tokenizer::pop(Tokenizer *this,vector<char,_std::allocator<char>_> *data)

{
  bool bVar1;
  reference __x;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  vector<char,_std::allocator<char>_> *data_local;
  Tokenizer *this_local;
  
  lock._M_device = (mutex_type *)data;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->queue_mutex_);
  bVar1 = std::
          deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::empty(&this->processed_data_queue_);
  if (!bVar1) {
    __x = std::
          deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::front(&this->processed_data_queue_);
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)lock._M_device,__x);
    std::
    deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::pop_front(&this->processed_data_queue_);
  }
  this_local._7_1_ = !bVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return this_local._7_1_;
}

Assistant:

bool pop(std::vector<char> &data) {
        std::lock_guard<std::mutex> lock(queue_mutex_);
        if (processed_data_queue_.empty()) {
            return false;
        } else {
            data = processed_data_queue_.front();
            processed_data_queue_.pop_front();
            return true;
        }
    }